

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O2

void __thiscall Atari2600::TIA::output_for_cycles(TIA *this,int number_of_cycles)

{
  bool bVar1;
  uint16_t *puVar2;
  uint uVar3;
  size_t number_of_samples;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint start;
  
  start = this->horizontal_counter_;
  iVar5 = number_of_cycles + start;
  this->horizontal_counter_ = iVar5;
  bVar1 = (int)start < 0xe0;
  if (start == 0) {
    memset(this->collision_buffer_,0,0xa0);
    (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time %
         0xe4;
    iVar6 = this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time;
    this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time =
         this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time % 0xe4;
    this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time = iVar6 % 0xe4;
    this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
    this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
  }
  draw_playfield(this,start + 4,iVar5 + 4);
  draw_object<Atari2600::TIA::Player>(this,this->player_,'\x04',start,this->horizontal_counter_);
  draw_object<Atari2600::TIA::Player>(this,this->player_ + 1,'\b',start,this->horizontal_counter_);
  draw_missile(this,this->missile_,this->player_,'\x10',start,this->horizontal_counter_);
  draw_missile(this,this->missile_ + 1,this->player_ + 1,' ',start,this->horizontal_counter_);
  draw_object<Atari2600::TIA::Ball>(this,&this->ball_,'\x02',start,this->horizontal_counter_);
  if ((this->output_mode_ | 2U) == 3) {
    if ((int)start < 0x10) {
      iVar6 = this->horizontal_counter_;
      if (0x10 < iVar6) {
        Outputs::CRT::CRT::output_sync(&this->crt_,start * -2 + 0x20);
        start = 0x10;
LAB_002ce7ad:
        iVar6 = this->horizontal_counter_;
        if (iVar6 < 0x21) goto LAB_002ce7b8;
        Outputs::CRT::CRT::output_blank(&this->crt_,start * -2 + 0x40);
        start = 0x20;
LAB_002ce814:
        if (this->horizontal_counter_ < 0x31) {
          iVar5 = this->horizontal_counter_ - start;
LAB_002ce885:
          Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,iVar5 * 2,')');
          goto LAB_002cea37;
        }
        Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,start * -2 + 0x60,')');
        start = 0x30;
        goto LAB_002ce83c;
      }
    }
    else {
      if (start < 0x20) goto LAB_002ce7ad;
      if (start < 0x30) goto LAB_002ce814;
      if (0xe3 < start) goto LAB_002ce8f6;
LAB_002ce83c:
      iVar6 = this->horizontal_counter_;
      if (0xe4 < iVar6) {
        Outputs::CRT::CRT::output_sync(&this->crt_,start * -2 + 0x1c8);
        start = 0xe4;
        goto LAB_002ce8f6;
      }
    }
    iVar6 = iVar6 - start;
  }
  else {
    if (0xf < (int)start) {
      if (start < 0x20) goto LAB_002ce7d7;
      if (start < 0x30) goto LAB_002ce878;
      if (0x43 < start) goto LAB_002ce8f6;
LAB_002ce8d0:
      iVar6 = this->horizontal_counter_;
      if (iVar6 < 0x45) {
LAB_002ce7b8:
        Outputs::CRT::CRT::output_blank(&this->crt_,(iVar6 - start) * 2);
        goto LAB_002cea37;
      }
      Outputs::CRT::CRT::output_blank(&this->crt_,start * -2 + 0x88);
      start = 0x44;
LAB_002ce8f6:
      if ((this->output_mode_ & 2) == 0) {
        if (this->pixels_start_location_ == 0) {
          this->pixels_start_location_ = start;
          puVar2 = (uint16_t *)Outputs::CRT::CRT::begin_data(&this->crt_,0xa0,1);
          this->pixel_target_ = puVar2;
        }
        else {
          puVar2 = this->pixel_target_;
        }
        if (puVar2 != (uint16_t *)0x0) {
          output_pixels(this,start,this->horizontal_counter_);
        }
        uVar3 = this->collision_flags_;
        uVar7 = start - 0x44;
        iVar6 = start * 2;
        for (lVar4 = (long)(int)start; (int)lVar4 < this->horizontal_counter_; lVar4 = lVar4 + 1) {
          uVar3 = uVar3 | this->collision_flags_by_buffer_vaules_[this->collision_buffer_[uVar7]];
          this->collision_flags_ = uVar3;
          uVar7 = uVar7 + 1;
          iVar6 = iVar6 + 2;
        }
        if (this->horizontal_counter_ == 0xe4) {
          Outputs::CRT::CRT::output_data
                    (&this->crt_,iVar6 + this->pixels_start_location_ * -2,
                     lVar4 - this->pixels_start_location_);
          this->pixel_target_ = (uint16_t *)0x0;
          this->pixels_start_location_ = 0;
        }
      }
      else {
        if (this->pixel_target_ != (uint16_t *)0x0) {
          output_pixels(this,this->pixels_start_location_,start);
          number_of_samples = (long)(int)start - (long)this->pixels_start_location_;
          Outputs::CRT::CRT::output_data(&this->crt_,(int)number_of_samples * 2,number_of_samples);
          this->pixel_target_ = (uint16_t *)0x0;
          this->pixels_start_location_ = 0;
        }
        iVar6 = 0xe4;
        if (this->horizontal_counter_ < 0xe4) {
          iVar6 = this->horizontal_counter_;
        }
        Outputs::CRT::CRT::output_blank(&this->crt_,(iVar6 - start) * 2);
      }
      if (bVar1 && 0xdf < iVar5) {
        this->horizontal_blank_extend_ = false;
      }
      goto LAB_002cea37;
    }
    iVar6 = this->horizontal_counter_;
    if (iVar6 < 0x11) goto LAB_002ce7b8;
    Outputs::CRT::CRT::output_blank(&this->crt_,start * -2 + 0x20);
    start = 0x10;
LAB_002ce7d7:
    if (0x20 < this->horizontal_counter_) {
      Outputs::CRT::CRT::output_sync(&this->crt_,start * -2 + 0x40);
      start = 0x20;
LAB_002ce878:
      if (0x30 < this->horizontal_counter_) {
        Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,start * -2 + 0x60,')');
        start = 0x30;
        goto LAB_002ce8d0;
      }
      iVar5 = this->horizontal_counter_ - start;
      goto LAB_002ce885;
    }
    iVar6 = this->horizontal_counter_ - start;
  }
  Outputs::CRT::CRT::output_sync(&this->crt_,iVar6 * 2);
LAB_002cea37:
  this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
  return;
}

Assistant:

void TIA::output_for_cycles(int number_of_cycles) {
	/*
		Line timing is oriented around 0 being the start of the right-hand side vertical blank;
		a wsync synchronises the CPU to horizontal_counter_ = 0. All timing below is in terms of the
		NTSC colour clock.

		Therefore, each line is composed of:

			16 cycles:	blank					; -> 16
			16 cycles:	sync					; -> 32
			16 cycles:	colour burst			; -> 48
			20 cycles:	blank					; -> 68
			8 cycles:	blank or pixels, depending on whether the blank extend bit is set
			152 cycles:	pixels
	*/
	int output_cursor = horizontal_counter_;
	horizontal_counter_ += number_of_cycles;
	bool is_reset = output_cursor < 224 && horizontal_counter_ >= 224;

	if(!output_cursor) {
		std::memset(collision_buffer_, 0, sizeof(collision_buffer_));

		ball_.motion_time %= 228;
		player_[0].motion_time %= 228;
		player_[1].motion_time %= 228;
		missile_[0].motion_time %= 228;
		missile_[1].motion_time %= 228;
	}

	// accumulate an OR'd version of the output into the collision buffer
	int latent_start = output_cursor + 4;
	int latent_end = horizontal_counter_ + 4;
	draw_playfield(latent_start, latent_end);
	draw_object<Player>(player_[0], uint8_t(CollisionType::Player0), output_cursor, horizontal_counter_);
	draw_object<Player>(player_[1], uint8_t(CollisionType::Player1), output_cursor, horizontal_counter_);
	draw_missile(missile_[0], player_[0], uint8_t(CollisionType::Missile0), output_cursor, horizontal_counter_);
	draw_missile(missile_[1], player_[1], uint8_t(CollisionType::Missile1), output_cursor, horizontal_counter_);
	draw_object<Ball>(ball_, uint8_t(CollisionType::Ball), output_cursor, horizontal_counter_);

	// convert to television signals

#define Period(function, target)	\
	if(output_cursor < target) { \
		if(horizontal_counter_ <= target) { \
			crt_.function((horizontal_counter_ - output_cursor) * 2); \
			horizontal_counter_ %= cycles_per_line; \
			return; \
		} else { \
			crt_.function((target - output_cursor) * 2); \
			output_cursor = target; \
		} \
	}

	switch(output_mode_) {
		default:
			Period(output_blank, 16)
			Period(output_sync, 32)
			Period(output_default_colour_burst, 48)
			Period(output_blank, 68)
		break;
		case sync_flag:
		case sync_flag | blank_flag:
			Period(output_sync, 16)
			Period(output_blank, 32)
			Period(output_default_colour_burst, 48)
			Period(output_sync, 228)
		break;
	}

#undef Period

	if(output_mode_ & blank_flag) {
		if(pixel_target_) {
			output_pixels(pixels_start_location_, output_cursor);
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
		int duration = std::min(228, horizontal_counter_) - output_cursor;
		crt_.output_blank(duration * 2);
	} else {
		if(!pixels_start_location_) {
			pixels_start_location_ = output_cursor;
			pixel_target_ = reinterpret_cast<uint16_t *>(crt_.begin_data(160));
		}

		// convert that into pixels
		if(pixel_target_) output_pixels(output_cursor, horizontal_counter_);

		// accumulate collision flags
		while(output_cursor < horizontal_counter_) {
			collision_flags_ |= collision_flags_by_buffer_vaules_[collision_buffer_[output_cursor - first_pixel_cycle]];
			output_cursor++;
		}

		if(horizontal_counter_ == cycles_per_line) {
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
	}

	if(is_reset) horizontal_blank_extend_ = false;

	horizontal_counter_ %= cycles_per_line;
}